

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

NodeIt __thiscall trieste::NodeDef::insert(NodeDef *this,NodeIt pos,NodeIt first,NodeIt last)

{
  NodeDef *this_00;
  iterator iVar1;
  NodeIt it;
  NodeIt NVar2;
  
  NVar2._M_current = first._M_current;
  if (first._M_current == last._M_current) {
    return (NodeIt)(NodeIt)pos._M_current;
  }
  for (; NVar2._M_current != last._M_current; NVar2._M_current = NVar2._M_current + 1) {
    this_00 = ((NVar2._M_current)->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)
              ._M_ptr;
    this_00->parent_ = this;
    add_flags(this_00);
  }
  iVar1 = std::
          vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,void>
                    ((vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                      *)&this->children,(const_iterator)pos._M_current,
                     (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                      )first._M_current,
                     (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                      )last._M_current);
  return (NodeIt)iVar1._M_current;
}

Assistant:

NodeIt insert(NodeIt pos, NodeIt first, NodeIt last)
    {
      if (first == last)
        return pos;

      for (auto it = first; it != last; ++it)
      {
        (*it)->parent_ = this;
        (*it)->add_flags();
      }

      return children.insert(pos, first, last);
    }